

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

LogEst whereRangeAdjust(WhereTerm *pTerm,LogEst nNew)

{
  LogEst LVar1;
  LogEst nRet;
  
  LVar1 = nNew;
  if (pTerm != (WhereTerm *)0x0) {
    if (pTerm->truthProb < 1) {
      LVar1 = pTerm->truthProb + nNew;
    }
    else {
      LVar1 = nNew + -0x14;
      if ((pTerm->wtFlags & 0x80) != 0) {
        LVar1 = nNew;
      }
    }
  }
  return LVar1;
}

Assistant:

static LogEst whereRangeAdjust(WhereTerm *pTerm, LogEst nNew){
  LogEst nRet = nNew;
  if( pTerm ){
    if( pTerm->truthProb<=0 ){
      nRet += pTerm->truthProb;
    }else if( (pTerm->wtFlags & TERM_VNULL)==0 ){
      nRet -= 20;        assert( 20==sqlite3LogEst(4) );
    }
  }
  return nRet;
}